

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RoboSimian::SetVisualizationTypeLimbs(RoboSimian *this,VisualizationType vis)

{
  __shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<chrono::robosimian::RS_Limb> limb;
  __shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var1 = &((this->m_limbs).
             super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((this->m_limbs).
                  super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,p_Var2);
    RS_Limb::SetVisualizationType(local_38._M_ptr,vis);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  return;
}

Assistant:

void RoboSimian::SetVisualizationTypeLimbs(VisualizationType vis) {
    for (auto limb : m_limbs)
        limb->SetVisualizationType(vis);
}